

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O0

value function_metadata_signature(function_conflict func)

{
  value pvVar1;
  value *str;
  value pvVar2;
  value *sig_array;
  value sig;
  value in_stack_00000050;
  size_t in_stack_ffffffffffffffd8;
  value *in_stack_ffffffffffffffe0;
  signature in_stack_fffffffffffffff8;
  
  pvVar1 = value_create_array(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (pvVar1 == (value)0x0) {
    pvVar1 = (value)0x0;
  }
  else {
    str = value_to_array((value)0x1076dc);
    pvVar2 = value_create_string((char *)str,in_stack_ffffffffffffffd8);
    *str = pvVar2;
    if (*str == (value)0x0) {
      value_type_destroy(in_stack_00000050);
      pvVar1 = (value)0x0;
    }
    else {
      pvVar2 = signature_metadata(in_stack_fffffffffffffff8);
      str[1] = pvVar2;
      if (str[1] == (value)0x0) {
        value_type_destroy(in_stack_00000050);
        pvVar1 = (value)0x0;
      }
    }
  }
  return pvVar1;
}

Assistant:

value function_metadata_signature(function func)
{
	static const char sig_str[] = "signature";

	value sig = value_create_array(NULL, 2);

	value *sig_array;

	if (sig == NULL)
	{
		return NULL;
	}

	sig_array = value_to_array(sig);

	sig_array[0] = value_create_string(sig_str, sizeof(sig_str) - 1);

	if (sig_array[0] == NULL)
	{
		value_type_destroy(sig);

		return NULL;
	}

	sig_array[1] = signature_metadata(func->s);

	if (sig_array[1] == NULL)
	{
		value_type_destroy(sig);

		return NULL;
	}

	return sig;
}